

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDMMCAnalyzerResults.cpp
# Opt level: O0

char * cmd_abbrev_from_number(uint cmd_number)

{
  char *pcStack_10;
  uint cmd_number_local;
  
  if ((cmd_number < 0x2b) || (0x2f < cmd_number)) {
    switch(cmd_number) {
    case 0:
      pcStack_10 = "GO_IDLE_STATE";
      break;
    case 1:
      pcStack_10 = "[reserved]";
      break;
    case 2:
      pcStack_10 = "ALL_SEND_CID";
      break;
    case 3:
      pcStack_10 = "SEND_RELATIVE_ADDR";
      break;
    case 4:
      pcStack_10 = "SET_DSR";
      break;
    case 5:
      pcStack_10 = "[reserved for SDIO]";
      break;
    case 6:
      pcStack_10 = "SWITCH_FUNC";
      break;
    case 7:
      pcStack_10 = "SELECT/DESELECT_CARD";
      break;
    case 8:
      pcStack_10 = "SEND_EXT_CSD";
      break;
    case 9:
      pcStack_10 = "SEND_CSD";
      break;
    case 10:
      pcStack_10 = "SEND_CID";
      break;
    case 0xb:
      pcStack_10 = "VOLTAGE_SWITCH";
      break;
    case 0xc:
      pcStack_10 = "STOP_TRANSMISSION";
      break;
    case 0xd:
      pcStack_10 = "SEND_STATUS";
      break;
    case 0xe:
      pcStack_10 = "[reserved]";
      break;
    case 0xf:
      pcStack_10 = "GO_INACTIVE_STATE";
      break;
    case 0x10:
      pcStack_10 = "SET_BLOCKLEN";
      break;
    case 0x11:
      pcStack_10 = "READ_SINGLE_BLOCK";
      break;
    case 0x12:
      pcStack_10 = "READ_MULTIPLE_BLOCK";
      break;
    case 0x13:
      pcStack_10 = "SEND_TUNING_BLOCK";
      break;
    case 0x14:
      pcStack_10 = "SPEED_CLASS_CONTROL";
      break;
    case 0x15:
      pcStack_10 = "[reserved for DPS]";
      break;
    case 0x16:
      pcStack_10 = "[reserved]";
      break;
    case 0x17:
      pcStack_10 = "SET_BLOCK_COUNT";
      break;
    case 0x18:
      pcStack_10 = "WRITE_BLOCK";
      break;
    case 0x19:
      pcStack_10 = "WRITE_MULTIPLE_BLOCK";
      break;
    case 0x1a:
      pcStack_10 = "[reserved for manufacturer]";
      break;
    case 0x1b:
      pcStack_10 = "PROGRAM_CSD";
      break;
    case 0x1c:
      pcStack_10 = "SWT_WRITE_PROT";
      break;
    case 0x1d:
      pcStack_10 = "CLR_WRITE_PROT";
      break;
    case 0x1e:
      pcStack_10 = "SEND_WRITE_PROT";
      break;
    case 0x1f:
      pcStack_10 = "[reserved]";
      break;
    case 0x20:
      pcStack_10 = "ERASE_WR_BLK_START";
      break;
    case 0x21:
      pcStack_10 = "ERASE_WR_BLK_END";
      break;
    case 0x22:
      pcStack_10 = "[function dependent]";
      break;
    case 0x23:
      pcStack_10 = "[function dependent]";
      break;
    case 0x24:
      pcStack_10 = "[function dependent]";
      break;
    case 0x25:
      pcStack_10 = "[function dependent]";
      break;
    case 0x26:
      pcStack_10 = "ERASE";
      break;
    case 0x27:
      pcStack_10 = "[reserved]";
      break;
    case 0x28:
      pcStack_10 = "[defined by DPS]";
      break;
    case 0x29:
      pcStack_10 = "[reserved]";
      break;
    case 0x2a:
      pcStack_10 = "LOCK_UNLOCK";
      break;
    default:
      pcStack_10 = "[invalid command number]";
      break;
    case 0x30:
      pcStack_10 = "READ_EXTR_SINGLE";
      break;
    case 0x31:
      pcStack_10 = "WRITE_EXTR_SINGLE";
      break;
    case 0x32:
      pcStack_10 = "[function dependent]";
      break;
    case 0x33:
      pcStack_10 = "[reserved]";
      break;
    case 0x34:
      pcStack_10 = "[sdio]";
      break;
    case 0x35:
      pcStack_10 = "[sdio]";
      break;
    case 0x36:
      pcStack_10 = "[sdio]";
      break;
    case 0x37:
      pcStack_10 = "APP_CMD";
      break;
    case 0x38:
      pcStack_10 = "GEN_CMD";
      break;
    case 0x39:
      pcStack_10 = "[function dependent]";
      break;
    case 0x3a:
      pcStack_10 = "READ_EXTR_MULTI";
      break;
    case 0x3b:
      pcStack_10 = "WRITE_EXTR_MULTI";
    }
  }
  else {
    pcStack_10 = "[reserved]";
  }
  return pcStack_10;
}

Assistant:

static const char* cmd_abbrev_from_number(unsigned int cmd_number)
{
	if (cmd_number >= 43 && cmd_number <= 47) return "[reserved]";
	switch (cmd_number) {
		case 0: return "GO_IDLE_STATE";
		case 1: return "[reserved]";
		case 2: return "ALL_SEND_CID";
		case 3: return "SEND_RELATIVE_ADDR";
		case 4: return "SET_DSR";
		case 5: return "[reserved for SDIO]";
		case 6: return "SWITCH_FUNC";
		case 7: return "SELECT/DESELECT_CARD";
		case 8: return "SEND_EXT_CSD";
		case 9: return "SEND_CSD";
		case 10: return "SEND_CID";
		case 11: return "VOLTAGE_SWITCH";
		case 12: return "STOP_TRANSMISSION";
		case 13: return "SEND_STATUS";
		case 14: return "[reserved]";
		case 15: return "GO_INACTIVE_STATE";
		case 16: return "SET_BLOCKLEN";
		case 17: return "READ_SINGLE_BLOCK";
		case 18: return "READ_MULTIPLE_BLOCK";
		case 19: return "SEND_TUNING_BLOCK";
		case 20: return "SPEED_CLASS_CONTROL";
		case 21: return "[reserved for DPS]";
		case 22: return "[reserved]";
		case 23: return "SET_BLOCK_COUNT";
		case 24: return "WRITE_BLOCK";
		case 25: return "WRITE_MULTIPLE_BLOCK";
		case 26: return "[reserved for manufacturer]";
		case 27: return "PROGRAM_CSD";
		case 28: return "SWT_WRITE_PROT";
		case 29: return "CLR_WRITE_PROT";
		case 30: return "SEND_WRITE_PROT";
		case 31: return "[reserved]";
		case 32: return "ERASE_WR_BLK_START";
		case 33: return "ERASE_WR_BLK_END";
		case 34: return "[function dependent]";
		case 35: return "[function dependent]";
		case 36: return "[function dependent]";
		case 37: return "[function dependent]";
		case 38: return "ERASE";
		case 39: return "[reserved]";
		case 40: return "[defined by DPS]";
		case 41: return "[reserved]";
		case 42: return "LOCK_UNLOCK";
		case 48: return "READ_EXTR_SINGLE";
		case 49: return "WRITE_EXTR_SINGLE";
		case 50: return "[function dependent]";
		case 51: return "[reserved]";
		case 52: return "[sdio]";
		case 53: return "[sdio]";
		case 54: return "[sdio]";
		case 55: return "APP_CMD";
		case 56: return "GEN_CMD";
		case 57: return "[function dependent]";
		case 58: return "READ_EXTR_MULTI";
		case 59: return "WRITE_EXTR_MULTI";
		default: return "[invalid command number]";
	}
}